

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

problem * __thiscall
anon_unknown.dwarf_f86ce::preprocessor<baryonyx::problem>::operator()
          (problem *__return_storage_ptr__,preprocessor<baryonyx::problem> *this,int variable_index,
          bool variable_value)

{
  unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  *this_00;
  pointer __args_1;
  double dVar1;
  int iVar2;
  pointer ppVar3;
  pointer pcVar4;
  pointer poVar5;
  pointer ppVar6;
  pointer ppVar7;
  pointer poVar8;
  context *pcVar9;
  pointer pvVar10;
  pointer pvVar11;
  size_type sVar12;
  to_merge_with_objective_function *ptVar13;
  bool bVar14;
  problem_solver_type pVar15;
  iterator iVar16;
  pointer poVar17;
  mapped_type *pmVar18;
  size_t sVar19;
  const_iterator cVar20;
  ulong uVar21;
  pointer pbVar22;
  int iVar23;
  pointer piVar24;
  pointer pcVar25;
  long lVar26;
  pointer poVar27;
  problem *ppVar28;
  pointer __args;
  pointer pbVar29;
  long lVar30;
  long lVar31;
  pointer poVar32;
  tuple<double,_baryonyx::show_size_type> *mem;
  int *__args_1_00;
  tuple<double,_baryonyx::show_size_type> *mem_00;
  ulong uVar33;
  ulong uVar34;
  pointer poVar35;
  double *pdVar36;
  basic_string_view<char,_std::char_traits<char>_> *__args_00;
  pointer poVar37;
  pointer copy;
  int iVar38;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  key_type local_2ec;
  int i;
  uint uStack_2e4;
  pointer pbStack_2e0;
  pointer pbStack_2d8;
  vector<signed_char,_std::allocator<signed_char>_> vStack_2d0;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> mapping;
  index index_to_affect;
  undefined4 uStack_294;
  __node_base _Stack_290;
  pointer pbStack_288;
  vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_> vStack_280;
  vector<int,_std::allocator<int>_> *local_268;
  vector<int,_std::allocator<int>_> *local_260;
  vector<int,_std::allocator<int>_> *local_258;
  to_merge_with_objective_function *local_250;
  int i_1;
  bool bStack_244;
  undefined3 uStack_243;
  pointer pbStack_240;
  undefined1 auStack_238 [16];
  pointer poStack_228;
  pointer ppStack_220;
  pointer local_218;
  baryonyx local_40 [16];
  
  this_00 = &this->vars;
  std::
  _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&this_00->_M_h);
  ppVar3 = (this->lifo).data.
           super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->lifo).data.
      super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar3) {
    (this->lifo).data.
    super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
  }
  ppVar28 = this->pb;
  piVar24 = (this->equal_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_258 = &this->equal_constraints;
  pcVar4 = (ppVar28->equal_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar25 = (ppVar28->equal_constraints).
                 super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                 _M_impl.super__Vector_impl_data._M_start; pcVar25 != pcVar4; pcVar25 = pcVar25 + 1)
  {
    *piVar24 = (int)((ulong)((long)(pcVar25->elements).
                                   super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pcVar25->elements).
                                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
    piVar24 = piVar24 + 1;
  }
  pcVar4 = (ppVar28->greater_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar24 = (this->greater_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_260 = &this->greater_constraints;
  for (pcVar25 = (ppVar28->greater_constraints).
                 super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                 _M_impl.super__Vector_impl_data._M_start; pcVar25 != pcVar4; pcVar25 = pcVar25 + 1)
  {
    *piVar24 = (int)((ulong)((long)(pcVar25->elements).
                                   super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pcVar25->elements).
                                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
    piVar24 = piVar24 + 1;
  }
  pcVar4 = (ppVar28->less_constraints).
           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar24 = (this->less_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  copy = (pointer)&this->less_constraints;
  for (pcVar25 = (ppVar28->less_constraints).
                 super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                 _M_impl.super__Vector_impl_data._M_start; pcVar25 != pcVar4; pcVar25 = pcVar25 + 1)
  {
    *piVar24 = (int)((ulong)((long)(pcVar25->elements).
                                   super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pcVar25->elements).
                                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
    piVar24 = piVar24 + 1;
  }
  if ((variable_index < 0) ||
     ((int)(((long)(this->cache).
                   super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->cache).
                  super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x48) <= variable_index)) {
    baryonyx::details::fail_fast
              ("Precondition","index >= 0 && index < bx::length(cache)",
               "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
               ,"435");
  }
  local_268 = (vector<int,_std::allocator<int>_> *)copy;
  pp_lifo::emplace(&this->lifo,variable_index,variable_value);
  affects(this);
  poVar5 = (this->merge_obj).elements.
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->merge_obj).elements.
      super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
      ._M_impl.super__Vector_impl_data._M_finish != poVar5) {
    (this->merge_obj).elements.
    super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
    ._M_impl.super__Vector_impl_data._M_finish = poVar5;
  }
  (this->merge_obj).value = 0.0;
  _i = (pair<int,_bool>)((ulong)uStack_2e4 << 0x20);
  ppVar6 = (this->cache).
           super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar7 = (this->cache).
           super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar38 = 0;
  while (iVar38 != (int)(((long)ppVar6 - (long)ppVar7) / 0x48)) {
    iVar16 = std::
             _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&this_00->_M_h,&i);
    iVar38 = i;
    if ((iVar16.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur ==
         (__node_type *)0x0) && (bVar14 = is_unused_variable(this,i), bVar14)) {
      poVar8 = (this->pb->objective).qelements.
               super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      poVar17 = (this->pb->objective).qelements.
                super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar30 = (long)poVar8 - (long)poVar17;
      poVar17 = poVar17 + 2;
      for (lVar26 = lVar30 >> 6; 0 < lVar26; lVar26 = lVar26 + -1) {
        if ((poVar17[-2].variable_index_a == iVar38) || (poVar17[-2].variable_index_b == iVar38)) {
          poVar27 = poVar17 + -2;
          goto LAB_00127482;
        }
        if ((poVar17[-1].variable_index_a == iVar38) || (poVar17[-1].variable_index_b == iVar38)) {
          poVar27 = poVar17 + -1;
          goto LAB_00127482;
        }
        poVar27 = poVar17;
        if ((poVar17->variable_index_a == iVar38) || (poVar17->variable_index_b == iVar38))
        goto LAB_00127482;
        if ((poVar17[1].variable_index_a == iVar38) || (poVar17[1].variable_index_b == iVar38)) {
          poVar27 = poVar17 + 1;
          goto LAB_00127482;
        }
        poVar17 = poVar17 + 4;
        lVar30 = lVar30 + -0x40;
      }
      lVar30 = lVar30 >> 4;
      poVar35 = poVar17 + -2;
      if (lVar30 == 1) goto LAB_001275f5;
      if (lVar30 == 3) {
        poVar27 = poVar35;
        if ((poVar17[-2].variable_index_a != iVar38) && (poVar17[-2].variable_index_b != iVar38)) {
          poVar35 = poVar17 + -1;
          goto LAB_0012746f;
        }
      }
      else {
        poVar27 = poVar8;
        if (lVar30 == 2) {
LAB_0012746f:
          poVar27 = poVar35;
          if ((poVar35->variable_index_a != iVar38) && (poVar35->variable_index_b != iVar38))
          goto LAB_001275f1;
        }
      }
LAB_00127482:
      poVar17 = poVar27;
      if (poVar17 != poVar8) {
        dVar1 = poVar17->factor;
        if (this->pb->type == maximize) {
          if (0.0 < dVar1) goto LAB_001274ad;
        }
        else if (dVar1 < 0.0) {
LAB_001274ad:
          iVar2 = poVar17->variable_index_a;
          if (iVar2 == poVar17->variable_index_b) {
            (this->merge_obj).value = dVar1 * 0.5 + (this->merge_obj).value;
          }
          else {
            _i_1 = (value_type)(dVar1 * 0.5);
            iVar23 = poVar17->variable_index_b;
            if (iVar2 != iVar38) {
              iVar23 = iVar2;
            }
            index_to_affect = iVar23;
            std::
            vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
            ::emplace_back<double,int_const&>
                      ((vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
                        *)&this->merge_obj,(double *)&i_1,&index_to_affect);
            iVar38 = i;
          }
        }
        lVar26 = 0;
        lVar31 = (long)poVar8 + (-0x10 - (long)poVar17);
        for (lVar30 = lVar31 >> 6; 0 < lVar30; lVar30 = lVar30 + -1) {
          if ((*(int *)((long)&poVar17[1].variable_index_a + lVar26) == iVar38) ||
             (*(int *)((long)&poVar17[1].variable_index_b + lVar26) == iVar38)) {
            poVar27 = (pointer)((long)&poVar17[1].factor + lVar26);
            goto LAB_00127482;
          }
          if ((*(int *)((long)&poVar17[2].variable_index_a + lVar26) == iVar38) ||
             (*(int *)((long)&poVar17[2].variable_index_b + lVar26) == iVar38)) {
            poVar27 = (pointer)((long)&poVar17[2].factor + lVar26);
            goto LAB_00127482;
          }
          if ((*(int *)((long)&poVar17[3].variable_index_a + lVar26) == iVar38) ||
             (*(int *)((long)&poVar17[3].variable_index_b + lVar26) == iVar38)) {
            poVar27 = (pointer)((long)&poVar17[3].factor + lVar26);
            goto LAB_00127482;
          }
          if ((*(int *)((long)&poVar17[4].variable_index_a + lVar26) == iVar38) ||
             (*(int *)((long)&poVar17[4].variable_index_b + lVar26) == iVar38)) {
            poVar27 = (pointer)((long)&poVar17[4].factor + lVar26);
            goto LAB_00127482;
          }
          lVar26 = lVar26 + 0x40;
        }
        poVar35 = (pointer)((long)&poVar17[1].factor + lVar26);
        lVar30 = lVar31 - lVar26 >> 4;
        if (lVar30 != 1) {
          if (lVar30 == 3) {
            poVar27 = poVar35;
            if ((*(int *)((long)&poVar17[1].variable_index_a + lVar26) == iVar38) ||
               (*(int *)((long)&poVar17[1].variable_index_b + lVar26) == iVar38)) goto LAB_00127482;
            poVar35 = (pointer)((long)&poVar17[2].factor + lVar26);
          }
          else {
            poVar27 = poVar8;
            if (lVar30 != 2) goto LAB_00127482;
          }
          poVar27 = poVar35;
          if ((poVar35->variable_index_a == iVar38) || (poVar35->variable_index_b == iVar38))
          goto LAB_00127482;
LAB_001275f1:
          poVar35 = poVar35 + 1;
        }
LAB_001275f5:
        poVar27 = poVar8;
        if (poVar35->variable_index_b == iVar38) {
          poVar27 = poVar35;
        }
        if (poVar35->variable_index_a == iVar38) {
          poVar27 = poVar35;
        }
        goto LAB_00127482;
      }
    }
    iVar38 = iVar38 + 1;
    _i = (pair<int,_bool>)CONCAT44(uStack_2e4,iVar38);
  }
  _i_1 = (value_type)((ulong)_i_1 & 0xffffffff00000000);
  ppVar6 = (this->cache).
           super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar7 = (this->cache).
           super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar38 = 0;
  local_250 = &this->merge_obj;
  while (iVar38 != (int)(((long)ppVar6 - (long)ppVar7) / 0x48)) {
    iVar16 = std::
             _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&this_00->_M_h,&i_1);
    iVar38 = i_1;
    if ((iVar16.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur ==
         (__node_type *)0x0) && (bVar14 = is_unused_variable(this,i_1), bVar14)) {
      ppVar28 = this->pb;
      poVar5 = (ppVar28->objective).elements.
               super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      poVar32 = (ppVar28->objective).elements.
                super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar26 = (long)poVar5 - (long)poVar32;
      poVar32 = poVar32 + 2;
      for (lVar30 = lVar26 >> 6; 0 < lVar30; lVar30 = lVar30 + -1) {
        if (poVar32[-2].variable_index == iVar38) {
          poVar37 = poVar32 + -2;
          goto LAB_00127705;
        }
        if (poVar32[-1].variable_index == iVar38) {
          poVar37 = poVar32 + -1;
          goto LAB_00127705;
        }
        poVar37 = poVar32;
        if (poVar32->variable_index == iVar38) goto LAB_00127705;
        if (poVar32[1].variable_index == iVar38) {
          poVar37 = poVar32 + 1;
          goto LAB_00127705;
        }
        poVar32 = poVar32 + 4;
        lVar26 = lVar26 + -0x40;
      }
      lVar26 = lVar26 >> 4;
      poVar37 = poVar32 + -2;
      if (lVar26 == 1) {
LAB_00127771:
        if (poVar37->variable_index != iVar38) {
          poVar37 = poVar5;
        }
LAB_00127705:
        if (poVar37 == poVar5) {
          bVar14 = true;
        }
        else {
          dVar1 = poVar37->factor;
          if (ppVar28->type == maximize) {
            bVar14 = dVar1 < 0.0;
          }
          else {
            bVar14 = 0.0 < dVar1;
          }
          bVar14 = !bVar14 && dVar1 != 0.0;
        }
      }
      else {
        if (lVar26 == 3) {
          if (poVar32[-2].variable_index != iVar38) {
            poVar37 = poVar32 + -1;
            goto LAB_00127767;
          }
          goto LAB_00127705;
        }
        bVar14 = true;
        if (lVar26 == 2) {
LAB_00127767:
          if (poVar37->variable_index != iVar38) {
            poVar37 = poVar37 + 1;
            goto LAB_00127771;
          }
          goto LAB_00127705;
        }
      }
      pmVar18 = std::__detail::
                _Map_base<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_00,&i_1);
      *pmVar18 = bVar14;
      iVar38 = i_1;
    }
    iVar38 = iVar38 + 1;
    i_1 = iVar38;
  }
  affects(this);
  _i = (pair<int,_bool>)(this->vars)._M_h._M_element_count;
  pcVar9 = this->ctx;
  sVar19 = baryonyx::memory_consumed(this->pb);
  baryonyx::memory_consumed_size<unsigned_long>(sVar19);
  baryonyx::to_string_abi_cxx11_((string *)&i_1,local_40,mem);
  baryonyx::info<unsigned_long,std::__cxx11::string>
            (pcVar9,"  - Preprocessor finish. Removed variables {} (size: {})\n",(unsigned_long *)&i
             ,(string *)&i_1);
  std::__cxx11::string::~string((string *)&i_1);
  (__return_storage_ptr__->vars).values.
  super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->type = maximize;
  __return_storage_ptr__->problem_type = equalities_01;
  (__return_storage_ptr__->less_constraints).
  super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->less_constraints).
  super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->vars).values.
  super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vars).values.
  super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vars).values.
  super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->objective).value = 0.0;
  (__return_storage_ptr__->equal_constraints).
  super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->equal_constraints).
  super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->equal_constraints).
  super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->greater_constraints).
  super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->greater_constraints).
  super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->greater_constraints).
  super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->less_constraints).
  super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->objective).elements.
  super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->objective).elements.
  super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->objective).elements.
  super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->objective).qelements.
  super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->objective).qelements.
  super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->objective).qelements.
  super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2> *)
             __return_storage_ptr__,
             (__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2> *)this->pb);
  ppVar28 = this->pb;
  __return_storage_ptr__->type = ppVar28->type;
  i_1 = -1;
  bStack_244 = false;
  std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::vector
            (&mapping,((long)(ppVar28->vars).values.
                             super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(ppVar28->vars).values.
                            super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0xc,(value_type *)&i_1,
             (allocator_type *)&i);
  _i_1 = (value_type)((ulong)_i_1 & 0xffffffff00000000);
  pvVar10 = (this->pb->vars).values.
            super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pvVar11 = (this->pb->vars).values.
            super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
            _M_impl.super__Vector_impl_data._M_start;
  iVar38 = 0;
  uVar34 = 0;
  while (iVar38 != (int)(((long)pvVar10 - (long)pvVar11) / 0xc)) {
    cVar20 = std::
             _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&this_00->_M_h,&i_1);
    if (cVar20.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur ==
        (__node_type *)0x0) {
      uVar33 = (ulong)((int)uVar34 + 1);
      uVar21 = uVar34;
    }
    else {
      uVar21 = ((ulong)*(byte *)((long)cVar20.
                                       super__Node_iterator_base<std::pair<const_int,_bool>,_false>.
                                       _M_cur + 0xc) << 0x20) + 0xffffffff;
      uVar33 = uVar34;
    }
    mapping.super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>._M_impl
    .super__Vector_impl_data._M_start[i_1].first = (int)uVar21;
    mapping.super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>._M_impl
    .super__Vector_impl_data._M_start[i_1].second = SUB81(uVar21 >> 0x20,0);
    iVar38 = i_1 + 1;
    i_1 = iVar38;
    uVar34 = uVar33;
  }
  ppVar28 = this->pb;
  if ((int)uVar34 !=
      (int)(((long)(ppVar28->vars).values.
                   super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(ppVar28->vars).values.
                  super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0xc) -
      (int)(this->vars)._M_h._M_element_count) {
    baryonyx::details::fail_fast
              ("Assertion","c == bx::length(pb.vars.values) - bx::length(vars)",
               "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
               ,"672");
  }
  poStack_228 = (pointer)0x0;
  ppStack_220 = (pointer)0x0;
  i_1 = 0;
  bStack_244 = false;
  uStack_243 = 0;
  pbStack_240 = (pointer)0x0;
  auStack_238._0_8_ = 0;
  auStack_238._8_8_ = 0;
  local_218 = (pointer)((ppVar28->objective).value + (this->merge_obj).value);
  poVar5 = (ppVar28->objective).elements.
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  poVar32 = (ppVar28->objective).elements.
            super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (uVar34 = 0; ((long)poVar5 - (long)poVar32 & 0xffffffff0U) != uVar34; uVar34 = uVar34 + 0x10)
  {
    poVar37 = (ppVar28->objective).elements.
              super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pdVar36 = (double *)((long)&poVar37->factor + uVar34);
    __args_1 = mapping.
               super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>.
               _M_impl.super__Vector_impl_data._M_start +
               *(int *)((long)&poVar37->variable_index + uVar34);
    if (__args_1->first == -1) {
      if (__args_1->second == true) {
        local_218 = (pointer)(*pdVar36 + (double)local_218);
      }
    }
    else {
      std::
      vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
      ::emplace_back<double_const&,int_const&>
                ((vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
                  *)&i_1,pdVar36,&__args_1->first);
      ppVar28 = this->pb;
    }
  }
  poVar8 = (ppVar28->objective).qelements.
           super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  poVar17 = (ppVar28->objective).qelements.
            super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (uVar34 = 0; ptVar13 = local_250, ((long)poVar8 - (long)poVar17 & 0xffffffff0U) != uVar34;
      uVar34 = uVar34 + 0x10) {
    poVar27 = (this->pb->objective).qelements.
              super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pdVar36 = (double *)((long)&poVar27->factor + uVar34);
    _i = mapping.super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>.
         _M_impl.super__Vector_impl_data._M_start
         [*(int *)((long)&poVar27->variable_index_a + uVar34)];
    _index_to_affect =
         mapping.super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>.
         _M_impl.super__Vector_impl_data._M_start
         [*(int *)((long)&poVar27->variable_index_b + uVar34)];
    if (i == -1) {
      __args_1_00 = &index_to_affect;
      if (index_to_affect == -1) {
        if ((((ulong)_i & 0x100000000) != 0) && (((ulong)_index_to_affect & 0x100000000) != 0)) {
          local_218 = (pointer)(*pdVar36 + (double)local_218);
        }
      }
      else {
LAB_00127a3b:
        std::
        vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
        ::emplace_back<double_const&,int&>
                  ((vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
                    *)&i_1,pdVar36,__args_1_00);
      }
    }
    else {
      __args_1_00 = &i;
      if (index_to_affect == -1) goto LAB_00127a3b;
      std::
      vector<baryonyx::objective_quadratic_element,std::allocator<baryonyx::objective_quadratic_element>>
      ::emplace_back<double_const&,int&,int&>
                ((vector<baryonyx::objective_quadratic_element,std::allocator<baryonyx::objective_quadratic_element>>
                  *)(auStack_238 + 8),pdVar36,__args_1_00,&index_to_affect);
    }
  }
  poVar5 = (this->merge_obj).elements.
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar34 = 0;
  poVar32 = (this->merge_obj).elements.
            super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (uVar34 == ((ulong)((long)poVar5 - (long)poVar32) >> 4 & 0xffffffff)) {
      baryonyx::objective_function::operator=
                (&__return_storage_ptr__->objective,(objective_function *)&i_1);
      baryonyx::objective_function::~objective_function((objective_function *)&i_1);
      ppVar28 = this->pb;
      sVar12 = (this->vars)._M_h._M_element_count;
      vStack_2d0.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_2d0.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      _i = (pair<int,_bool>)0x0;
      pbStack_2e0 = (pointer)0x0;
      pbStack_2d8 = (pointer)0x0;
      vStack_2d0.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::reserve((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)&i,((long)(ppVar28->affected_vars).names.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(ppVar28->affected_vars).names.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4) + sVar12);
      std::vector<signed_char,_std::allocator<signed_char>_>::reserve
                (&vStack_2d0,
                 (size_type)
                 ((ppVar28->affected_vars).values.
                  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_finish +
                 (sVar12 - (long)(ppVar28->affected_vars).values.
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<std::basic_string_view<char,std::char_traits<char>>const*,std::back_insert_iterator<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>>
                ((ppVar28->affected_vars).names.
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (ppVar28->affected_vars).names.
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)&i);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<signed_char_const*,std::back_insert_iterator<std::vector<signed_char,std::allocator<signed_char>>>>
                ((ppVar28->affected_vars).values.
                 super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (ppVar28->affected_vars).values.
                 super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,&vStack_2d0);
      vStack_280.
      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_280.
      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      _index_to_affect = (pair<int,_bool>)0x0;
      _Stack_290._M_nxt = (_Hash_node_base *)0x0;
      pbStack_288 = (pointer)0x0;
      vStack_280.
      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::reserve((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)&index_to_affect,
                ((long)(this->pb->vars).names.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->pb->vars).names.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) -
                (this->vars)._M_h._M_element_count);
      std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::reserve
                (&vStack_280,
                 ((long)(this->pb->vars).names.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->pb->vars).names.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) -
                 (this->vars)._M_h._M_element_count);
      lVar26 = 0;
      pvVar10 = (this->pb->vars).values.
                super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pvVar11 = (this->pb->vars).values.
                super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar30 = 0;
      for (lVar31 = 0; ((long)pvVar10 - (long)pvVar11) / 0xc != lVar31; lVar31 = lVar31 + 1) {
        local_2ec = (key_type)lVar31;
        cVar20 = std::
                 _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&this_00->_M_h,&local_2ec);
        __args_00 = (basic_string_view<char,_std::char_traits<char>_> *)
                    ((long)&((this->pb->vars).names.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_len + lVar30);
        if (cVar20.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur ==
            (__node_type *)0x0) {
          std::
          vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::emplace_back<std::basic_string_view<char,std::char_traits<char>>const&>
                    ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)&index_to_affect,__args_00);
          std::vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>>::
          emplace_back<baryonyx::variable_value_const&>
                    ((vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>> *)
                     &vStack_280,
                     (variable_value *)
                     ((long)&((this->pb->vars).values.
                              super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                              ._M_impl.super__Vector_impl_data._M_start)->min + lVar26));
        }
        else {
          std::
          vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::emplace_back<std::basic_string_view<char,std::char_traits<char>>const&>
                    ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)&i,__args_00);
          std::vector<signed_char,std::allocator<signed_char>>::emplace_back<bool_const&>
                    ((vector<signed_char,std::allocator<signed_char>> *)&vStack_2d0,
                     (bool *)((long)cVar20.
                                    super__Node_iterator_base<std::pair<const_int,_bool>,_false>.
                                    _M_cur + 0xc));
        }
        lVar26 = lVar26 + 0xc;
        lVar30 = lVar30 + 0x10;
      }
      std::_Tuple_impl<0ul,baryonyx::variables,baryonyx::affected_variables>::
      _Tuple_impl<baryonyx::variables&,baryonyx::affected_variables&,void>
                ((_Tuple_impl<0ul,baryonyx::variables,baryonyx::affected_variables> *)&i_1,
                 (variables *)&index_to_affect,(affected_variables *)&i);
      baryonyx::variables::~variables((variables *)&index_to_affect);
      baryonyx::affected_variables::~affected_variables((affected_variables *)&i);
      _i = (pair<int,_bool>)&__return_storage_ptr__->affected_vars;
      pbStack_2e0 = (pointer)&__return_storage_ptr__->vars;
      std::tuple<baryonyx::variables&,baryonyx::affected_variables&>::operator=
                ((tuple<baryonyx::variables&,baryonyx::affected_variables&> *)&i,
                 (tuple<baryonyx::variables,_baryonyx::affected_variables> *)&i_1);
      std::_Tuple_impl<0UL,_baryonyx::variables,_baryonyx::affected_variables>::~_Tuple_impl
                ((_Tuple_impl<0UL,_baryonyx::variables,_baryonyx::affected_variables> *)&i_1);
      pvVar10 = (this->pb->vars).values.
                super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pvVar11 = (this->pb->vars).values.
                super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                ._M_impl.super__Vector_impl_data._M_start;
      for (lVar26 = 0; (((long)pvVar10 - (long)pvVar11) / 0xc & 0xffffffffU) << 3 != lVar26;
          lVar26 = lVar26 + 8) {
        lVar30 = (long)*(int *)((long)&(mapping.
                                        super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->first + lVar26);
        if (-1 < lVar30) {
          copy = (__return_storage_ptr__->vars).names.
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          pbVar22 = (this->pb->vars).names.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          __y._M_str = copy[lVar30]._M_str;
          __y._M_len = copy[lVar30]._M_len;
          __x._M_str = *(char **)((long)&pbVar22->_M_str + lVar26 * 2);
          __x._M_len = *(size_t *)((long)&pbVar22->_M_len + lVar26 * 2);
          bVar14 = std::operator==(__x,__y);
          if (!bVar14) {
            baryonyx::details::fail_fast
                      ("Postcondition","pb.vars.names[i] == copy.vars.names[mapping[i].first]",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
                       ,"680");
          }
        }
      }
      constraints_exclude_copy
                ((preprocessor<baryonyx::problem> *)&mapping,
                 (vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)local_258,
                 (vector<int,_std::allocator<int>_> *)&this->pb->equal_constraints,
                 &__return_storage_ptr__->equal_constraints,
                 (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)copy);
      constraints_exclude_copy
                ((preprocessor<baryonyx::problem> *)&mapping,
                 (vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)local_260,
                 (vector<int,_std::allocator<int>_> *)&this->pb->greater_constraints,
                 &__return_storage_ptr__->greater_constraints,
                 (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)copy);
      constraints_exclude_copy
                ((preprocessor<baryonyx::problem> *)&mapping,
                 (vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)local_268,
                 (vector<int,_std::allocator<int>_> *)&this->pb->less_constraints,
                 &__return_storage_ptr__->less_constraints,
                 (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)copy);
      iVar38 = (int)(((long)(__return_storage_ptr__->vars).values.
                            super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(__return_storage_ptr__->vars).values.
                           super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0xc);
      bVar14 = is_valid_variable_index(&__return_storage_ptr__->equal_constraints,iVar38);
      if (((bVar14) &&
          (bVar14 = is_valid_variable_index(&__return_storage_ptr__->greater_constraints,iVar38),
          bVar14)) &&
         (bVar14 = is_valid_variable_index(&__return_storage_ptr__->less_constraints,iVar38), bVar14
         )) {
        pVar15 = baryonyx::problem::which_problem_type(__return_storage_ptr__);
        __return_storage_ptr__->problem_type = pVar15;
        pcVar9 = this->ctx;
        sVar19 = baryonyx::memory_consumed(__return_storage_ptr__);
        baryonyx::memory_consumed_size<unsigned_long>(sVar19);
        baryonyx::to_string_abi_cxx11_((string *)&i_1,(baryonyx *)&i,mem_00);
        baryonyx::info<std::__cxx11::string>
                  (pcVar9,"- Preprocessing finishes (size: {})\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1);
        std::__cxx11::string::~string((string *)&i_1);
        std::ofstream::ofstream(&i_1,"preprocessed.lp",_S_out);
        baryonyx::operator<<((ostream *)&i_1,__return_storage_ptr__);
        std::ofstream::~ofstream(&i_1);
        std::_Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::
        ~_Vector_base(&mapping.
                       super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>
                     );
        return __return_storage_ptr__;
      }
      baryonyx::details::fail_fast
                ("Postcondition",
                 "is_valid_variable_index(copy.equal_constraints, bx::length(copy.vars.values)) && is_valid_variable_index(copy.greater_constraints, bx::length(copy.vars.values)) && is_valid_variable_index(copy.less_constraints, bx::length(copy.vars.values))"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
                 ,"702");
    }
    lVar30 = (long)pbStack_240 - (long)_i_1;
    pbVar22 = (pointer)((long)_i_1 + 0x20);
    for (lVar26 = lVar30 >> 6; 0 < lVar26; lVar26 = lVar26 + -1) {
      if (uVar34 == *(uint *)&pbVar22[-2]._M_str) {
        __args = pbVar22 + -2;
        goto LAB_00127b1a;
      }
      if (uVar34 == *(uint *)&pbVar22[-1]._M_str) {
        __args = pbVar22 + -1;
        goto LAB_00127b1a;
      }
      __args = pbVar22;
      if (uVar34 == *(uint *)&pbVar22->_M_str) goto LAB_00127b1a;
      if (uVar34 == *(uint *)&pbVar22[1]._M_str) {
        __args = pbVar22 + 1;
        goto LAB_00127b1a;
      }
      pbVar22 = pbVar22 + 4;
      lVar30 = lVar30 + -0x40;
    }
    lVar30 = lVar30 >> 4;
    pbVar29 = pbVar22 + -2;
    if (lVar30 == 1) {
LAB_00127b6d:
      __args = pbVar29;
      if (uVar34 != *(uint *)&pbVar29->_M_str) {
        __args = pbStack_240;
      }
LAB_00127b1a:
      if (__args == pbStack_240) goto LAB_00127b3b;
      __args->_M_len =
           (size_t)((ptVar13->elements).
                    super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar34].factor +
                   (double)__args->_M_len);
    }
    else {
      if (lVar30 == 3) {
        __args = pbVar29;
        if (uVar34 != *(uint *)&pbVar22[-2]._M_str) {
          pbVar29 = pbVar22 + -1;
          goto LAB_00127b61;
        }
        goto LAB_00127b1a;
      }
      __args = pbStack_240;
      if (lVar30 == 2) {
LAB_00127b61:
        __args = pbVar29;
        if (uVar34 != *(uint *)&pbVar29->_M_str) {
          pbVar29 = pbVar29 + 1;
          goto LAB_00127b6d;
        }
        goto LAB_00127b1a;
      }
LAB_00127b3b:
      std::
      vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
      ::emplace_back<double&,int&>
                ((vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
                  *)&i_1,(double *)__args,(int *)&__args->_M_str);
    }
    uVar34 = uVar34 + 1;
  } while( true );
}

Assistant:

bx::problem operator()(int variable_index, bool variable_value)
    {
        vars.clear();
        lifo.clear();
        init_constraints_length_container();

        affect_variable(variable_index, variable_value);
        affects();

        make_lp_from_bqp_objective();
        try_remove_unused_variable();
        affects();

        info(ctx,
             "  - Preprocessor finish. Removed variables {} (size: {})\n",
             vars.size(),
             to_string(bx::memory_consumed_size(memory_consumed(pb))));

        return make_problem();
    }